

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O2

NormalizationResult * __thiscall
Kernel::normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>>
          (NormalizationResult *__return_storage_ptr__,Kernel *this,TermList t,
          NormalizationResult *ts,bool *simplified)

{
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_PolynomialNormalizer_cpp:339:19),_Kernel::PolyNf>_>
  it;
  uint uVar1;
  TermList *pTVar2;
  bool bVar3;
  Interpretation IVar4;
  uint *rhs;
  FuncId FVar5;
  anon_class_1_0_00000001 singletonProduct;
  Option<const_Kernel::RationalConstantType_&> n;
  FuncId fn;
  Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  res;
  anon_class_1_0_00000001 local_171;
  Kernel *local_170;
  NumTraits<Kernel::RationalConstantType> local_168 [4];
  NumTraits<Kernel::RationalConstantType> aNStackY_164 [4];
  undefined8 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea8 [16];
  undefined8 in_stack_fffffffffffffeb8;
  FuncId local_130;
  Variable local_11c [3];
  Kernel **ppKStack_110;
  undefined8 local_108;
  uint uStack_100;
  Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> local_f8;
  RationalConstantType local_e8;
  FuncTerm local_c8;
  PolyNf local_98;
  OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_80;
  PolyNf local_48;
  
  local_170 = (Kernel *)t._content;
  if (((ulong)this & 1) != 0) {
    Variable::Variable(local_11c,(uint)((ulong)this >> 2));
    PolyNf::PolyNf(&local_48,local_11c[0]);
    normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_1_0_00000001::
    operator()(__return_storage_ptr__,&local_171,&local_48);
    return __return_storage_ptr__;
  }
  NumTraits<Kernel::RationalConstantType>::
  ifLinMul<Kernel::normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::TermList,Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,bool&)::_lambda(auto:1&,auto:2)_1_>
            ((Term *)in_stack_fffffffffffffea0,(anon_class_16_2_400f5052)in_stack_fffffffffffffea8);
  if (local_80._isSome == true) {
    Lib::CoproductImpl::TrivialOperations::MoveCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
    ::DefaultImpl(&__return_storage_ptr__->_inner,
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   *)&local_80._elem);
    goto LAB_00470641;
  }
  NumTraits<Kernel::RationalConstantType>::tryNumeral(local_168,(Term *)this);
  if ((RationalConstantType *)CONCAT71(stack0xfffffffffffffe99,local_168[0]) !=
      (RationalConstantType *)0x0) {
    RationalConstantType::RationalConstantType
              (&local_e8,(RationalConstantType *)CONCAT71(stack0xfffffffffffffe99,local_168[0]));
    wrapNumeral<Kernel::RationalConstantType>(__return_storage_ptr__,&local_e8);
    RationalConstantType::~RationalConstantType(&local_e8);
    goto LAB_00470641;
  }
  FVar5 = FuncId::symbolOf((Term *)this);
  local_130._typeArgs = FVar5._typeArgs;
  local_130._num = FVar5._num;
  bVar3 = FuncId::isInterpreted(&local_130);
  if (bVar3) {
    IVar4 = FuncId::interpretation(&local_130);
    rhs = &switchD_004704c1::switchdataD_00743ab8;
    switch(IVar4) {
    case RAT_UNARY_MINUS:
      normalizeMinus<Kernel::NumTraits<Kernel::RationalConstantType>>
                (__return_storage_ptr__,local_170,ts,(bool *)&switchD_004704c1::switchdataD_00743ab8
                );
      break;
    case RAT_PLUS:
      normalizeAdd<Kernel::NumTraits<Kernel::RationalConstantType>>
                (__return_storage_ptr__,local_170,(NormalizationResult *)(local_170 + 0x34),
                 (NormalizationResult *)&switchD_004704c1::switchdataD_00743ab8);
      break;
    case RAT_MINUS:
      normalizeMinus<Kernel::NumTraits<Kernel::RationalConstantType>>
                ((NormalizationResult *)local_168,local_170 + 0x34,ts,
                 (bool *)&switchD_004704c1::switchdataD_00743ab8);
      normalizeAdd<Kernel::NumTraits<Kernel::RationalConstantType>>
                (__return_storage_ptr__,local_170,(NormalizationResult *)local_168,
                 (NormalizationResult *)rhs);
      Lib::CoproductImpl::TrivialOperations::Destr::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      *)local_168);
      break;
    case RAT_MULTIPLY:
      normalizeMul<Kernel::NumTraits<Kernel::RationalConstantType>>
                (__return_storage_ptr__,local_170,(NormalizationResult *)(local_170 + 0x34),ts,
                 simplified);
      break;
    default:
      IVar4 = FuncId::interpretation(&local_130);
      normalizeSpecializedFractional<Kernel::NumTraits<Kernel::RationalConstantType>>
                ((Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  *)local_168,(Kernel *)(ulong)IVar4,(Interpretation)local_170,ts,simplified);
      if (local_168[0] == (NumTraits<Kernel::RationalConstantType>)0x1) {
        Lib::CoproductImpl::TrivialOperations::MoveCons::
        DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
        ::DefaultImpl(&__return_storage_ptr__->_inner,
                      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       *)(local_168 + 4));
        Lib::
        OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ::~OptionBase((OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       *)local_168);
        break;
      }
      Lib::
      OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ::~OptionBase((OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     *)local_168);
      goto LAB_00470589;
    }
  }
  else {
LAB_00470589:
    pTVar2 = local_130._typeArgs;
    uVar1 = local_130._num;
    uStack_100 = FuncId::numTermArguments(&local_130);
    local_108 = 0;
    it._iter._inner._func.a =
         (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          **)in_stack_fffffffffffffea8._0_8_;
    it._iter._inner._inner._next = in_stack_fffffffffffffea8._8_4_;
    it._iter._inner._inner._from = in_stack_fffffffffffffea8._12_4_;
    it._iter._0_8_ = in_stack_fffffffffffffea0;
    it._iter._inner._16_8_ = in_stack_fffffffffffffeb8;
    ppKStack_110 = &local_170;
    Lib::Stack<Kernel::PolyNf>::
    fromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,unsigned_int>(Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*&,unsigned_int)::_lambda(auto:1)_1_,Li___ConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>&)_1_,Kernel::PolyNf>>>
              (it);
    FVar5._4_4_ = 0;
    FVar5._num = uVar1;
    FVar5._typeArgs = pTVar2;
    FuncTerm::FuncTerm(&local_c8,FVar5,(Stack<Kernel::PolyNf> *)local_168);
    Lib::perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>((Lib *)&local_f8,&local_c8);
    PolyNf::PolyNf(&local_98,&local_f8);
    normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_1_0_00000001::
    operator()(__return_storage_ptr__,&local_171,&local_98);
    Lib::Stack<Kernel::PolyNf>::~Stack(&local_c8._args);
    Lib::Stack<Kernel::PolyNf>::~Stack((Stack<Kernel::PolyNf> *)local_168);
  }
LAB_00470641:
  Lib::
  OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::~OptionBase(&local_80);
  return __return_storage_ptr__;
}

Assistant:

NormalizationResult normalizeNumSort(TermList t, NormalizationResult* ts, bool& simplified)
{
  using Polynom      = Polynom<NumTraits>;
  using PreMonom     = PreMonom    <NumTraits>;

  auto singletonProduct = [](PolyNf t) -> NormalizationResult {
    return NormalizationResult(PreMonom({t}));
  };

  if (t.isVar()) {
    return singletonProduct(PolyNf(Variable(t.var())));

  } else {
    auto term = t.term();
    auto res = NumTraits::ifLinMul(term, [&](auto& n, auto t) -> NormalizationResult {
        auto& inner = ts[0];
        ASS(inner.is<Polynom>() || inner.is<PreMonom>())
        if (inner.is<Polynom>()) {
          return NormalizationResult(
              PreMonom(n, {RenderPolyNf{}(std::move(*inner.template as<Polynom>()))}));
        } else {
          if (inner.as<PreMonom>()->numeral != 1 && n != 1) {
            simplified = true;
          }
          inner.as<PreMonom>()->numeral *= n;
          return std::move(inner);
        }
    });
    if (res) return std::move(*res);
    if (auto n = NumTraits::tryNumeral(term)) {
      return wrapNumeral(*n);
    }
    auto fn = FuncId::symbolOf(term);
    if (fn.isInterpreted()) {
      switch(fn.interpretation()) {
        case NumTraits::mulI:
          ASS(ts != nullptr);
          return normalizeMul<NumTraits>(ts[0], ts[1], simplified);
        case NumTraits::addI:
          ASS(ts != nullptr);
          return normalizeAdd<NumTraits>(ts[0], ts[1]);
        case NumTraits::binMinusI:{
          ASS(ts != nullptr);
          auto rhs = normalizeMinus<NumTraits>(ts[1], simplified);
          return normalizeAdd<NumTraits>(ts[0], rhs);
        }
        case NumTraits::minusI:
          ASS(ts != nullptr);
          return normalizeMinus<NumTraits>(ts[0], simplified);
        default:
        {
          auto out = normalizeSpecialized<NumTraits>(fn.interpretation(), ts, simplified);
          if (out.isSome()) {
            return std::move(out.unwrap());
          }
        }
      }
    }

    return singletonProduct(PolyNf(perfect(FuncTerm(
        fn, 
        Stack<PolyNf>::fromIterator(
            arrayIter(ts, fn.numTermArguments())
            .map( [](NormalizationResult& r) -> PolyNf { return std::move(r).apply(RenderPolyNf{}); }))
      )
    )));
  }
}